

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_print_option(FILE *fp,char *shortopts,char *longopts,char *datatype,char *suffix)

{
  char *__s;
  char syntax [200];
  char *in_stack_fffffffffffffef8;
  char local_f8 [200];
  
  memset(local_f8,0,200);
  __s = "";
  if (suffix != (char *)0x0) {
    __s = suffix;
  }
  arg_cat_optionv(local_f8,(size_t)shortopts,longopts,datatype,(char *)0x0,0x10b632,
                  in_stack_fffffffffffffef8);
  fputs(local_f8,(FILE *)fp);
  fputs(__s,(FILE *)fp);
  return;
}

Assistant:

void arg_print_option(FILE * fp,
					  const char * shortopts,
					  const char * longopts,
					  const char * datatype,
					  const char * suffix) {
	char syntax[200] = "";
	suffix = suffix ? suffix : "";

	/* there is no way of passing the proper optvalue for optional argument values here, so we must ignore it */
	arg_cat_optionv(syntax,
					sizeof(syntax),
					shortopts,
					longopts,
					datatype,
					0,
					"|");

	fputs(syntax, fp);
	fputs(suffix, fp);
}